

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O1

void server::editmute_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  uint cn;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  clientinfo *ci;
  string mutemsg;
  stringformatter local_140;
  char local_138 [272];
  
  bVar1 = QServ::getlastSA(&qs);
  if (bVar1) {
    cn = atoi(args[1]);
    if (1000 < cn) {
      iVar2 = QServ::getSender(&qs);
      pcVar4 = QServ::getCommandDesc(&qs,cid);
      goto LAB_00156eac;
    }
  }
  else {
    cn = QServ::getSender(&qs);
  }
  ci = QServ::getClient(&qs,cn);
  if (ci != (clientinfo *)0x0) {
    if (ci->connected == true) {
      uVar3 = QServ::getSender(&qs);
      if ((((cn < 0x3e9) && (cn != uVar3)) && (ci->connected == true)) && (args[1] != (char *)0x0))
      {
        ci->isEditMuted = true;
        sendf(ci->clientnum,1,"ris",0x23,"\f7Your edits \f3will not \f7show up to others.");
        local_140.buf = local_138;
        pcVar4 = colorname(ci);
        stringformatter::operator()(&local_140,"\f0%s\f7\'s edits have been \f3muted",pcVar4);
        iVar2 = QServ::getSender(&qs);
        sendf(iVar2,1,"ris",0x23,local_138);
      }
    }
    return;
  }
  iVar2 = QServ::getSender(&qs);
  pcVar4 = "\f3Error: Player not connected";
LAB_00156eac:
  sendf(iVar2,1,"ris",0x23,pcVar4);
  return;
}

Assistant:

QSERV_CALLBACK editmute_cmd(p) {
        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    editmuteprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                             if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL) {
                                ci->isEditMuted = true;
                                sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f7Your edits \f3will not \f7show up to others.");
                                   defformatstring(mutemsg)("\f0%s\f7's edits have been \f3muted", colorname(ci));
                                sendf(CMD_SENDER, 1, "ris", N_SERVMSG, mutemsg);
                                }
                                                   
                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto editmuteprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }